

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int c14nCommonTest(char *filename,int with_comments,int mode,char *subdir)

{
  int iVar1;
  uint size;
  char *pcVar2;
  size_t sVar3;
  char *__ptr;
  char *filename_00;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  undefined8 uVar11;
  long *plVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  char *nslist;
  stat buf_1;
  char buf [500];
  char prefix [500];
  char *local_4d8;
  int local_4d0;
  int local_4cc;
  long local_4c8;
  int local_4bc;
  stat64 local_4b8;
  char local_428 [499];
  undefined1 local_235;
  undefined1 local_228 [504];
  
  local_4d0 = mode;
  local_4cc = with_comments;
  pcVar2 = baseFilename(filename);
  sVar3 = strlen(pcVar2);
  sVar3 = (size_t)((int)sVar3 + -4);
  memcpy(local_228,pcVar2,sVar3);
  local_228[sVar3] = 0;
  iVar1 = snprintf(local_428,499,"result/c14n/%s/%s",subdir,local_228);
  if (0x1f2 < iVar1) {
    local_235 = 0;
  }
  pcVar2 = strdup(local_428);
  iVar1 = snprintf(local_428,499,"test/c14n/%s/%s.xpath",subdir,local_228);
  if (0x1f2 < iVar1) {
    local_235 = 0;
  }
  iVar1 = stat64(local_428,&local_4b8);
  __ptr = (char *)0x0;
  if ((iVar1 != -1) && ((local_4b8.st_mode & 0xf000) == 0x8000)) {
    __ptr = strdup(local_428);
  }
  iVar1 = snprintf(local_428,499,"test/c14n/%s/%s.ns",subdir,local_228);
  if (0x1f2 < iVar1) {
    local_235 = 0;
  }
  iVar1 = stat64(local_428,&local_4b8);
  filename_00 = (char *)0x0;
  if ((iVar1 != -1) && ((local_4b8.st_mode & 0xf000) == 0x8000)) {
    filename_00 = strdup(local_428);
  }
  nb_tests = nb_tests + 1;
  local_4b8.st_dev = 0;
  local_4d8 = (char *)0x0;
  lVar4 = xmlReadFile(filename,0,0x4a);
  if (lVar4 == 0) {
    fprintf(_stderr,"Error: unable to parse file \"%s\"\n",filename);
  }
  else {
    lVar5 = xmlDocGetRootElement(lVar4);
    if (lVar5 == 0) {
      fprintf(_stderr,"Error: empty document for file \"%s\"\n",filename);
      xmlFreeDoc(lVar4);
    }
    else {
      if (__ptr != (char *)0x0) {
        lVar5 = xmlReadFile(__ptr,0,10);
        if (lVar5 == 0) {
          fprintf(_stderr,"Error: unable to parse file \"%s\"\n",__ptr);
        }
        else {
          lVar6 = xmlDocGetRootElement(lVar5);
          if (lVar6 == 0) {
            fprintf(_stderr,"Error: empty document for file \"%s\"\n",__ptr);
            xmlFreeDoc(lVar5);
          }
          else {
            for (lVar6 = *(long *)(lVar5 + 0x18); lVar6 != 0; lVar6 = *(long *)(lVar6 + 0x30)) {
              iVar1 = xmlStrEqual(*(undefined8 *)(lVar6 + 0x10),"XPath");
              if (iVar1 != 0) {
                lVar7 = xmlNodeGetContent(lVar6);
                if (lVar7 == 0) {
                  fprintf(_stderr,"Error: XPath content element is NULL \"%s\"\n",__ptr);
                  xmlFreeDoc(lVar5);
                  goto LAB_0010ee4c;
                }
                lVar8 = xmlXPathNewContext(lVar4);
                if (lVar8 != 0) {
                  plVar12 = (long *)(lVar6 + 0x60);
                  goto LAB_0010eba7;
                }
                c14nCommonTest_cold_3();
                goto LAB_0010ee4c;
              }
            }
            fprintf(_stderr,"Error: XPath element expected in the file  \"%s\"\n",__ptr);
            xmlFreeDoc(lVar5);
          }
        }
        goto LAB_0010ee4c;
      }
      lVar6 = 0;
LAB_0010ec26:
      if (filename_00 == (char *)0x0) goto LAB_0010ee65;
      iVar1 = loadMem(filename_00,&local_4d8,&local_4bc);
      pcVar13 = local_4d8;
      if (iVar1 != 0) {
        c14nCommonTest_cold_5();
        goto LAB_0010ef09;
      }
      if (local_4d8 == (char *)0x0) {
LAB_0010ee65:
        puVar10 = (undefined8 *)0x0;
      }
      else {
        iVar1 = xmlStrlen(local_4d8);
        if ((*pcVar13 == '\'') && (pcVar13[(long)iVar1 + -1] == '\'')) {
          pcVar13[(long)iVar1 + -1] = '\0';
          pcVar13 = pcVar13 + 1;
        }
        puVar9 = (undefined8 *)(*_xmlMalloc)(8000);
        if (puVar9 == (undefined8 *)0x0) {
          perror("malloc failed");
          goto LAB_0010ee65;
        }
        puVar10 = puVar9;
        if (*pcVar13 != '\0') {
          iVar1 = 1000;
          do {
            uVar15 = (long)puVar9 - (long)puVar10;
            if ((long)(iVar1 + -10) < (long)uVar15 >> 3) {
              iVar1 = iVar1 * 2;
              local_4c8 = lVar6;
              puVar10 = (undefined8 *)(*_xmlRealloc)(puVar10,(long)iVar1 << 3);
              if (puVar10 == (undefined8 *)0x0) {
                perror("realloc failed");
                puVar10 = (undefined8 *)0x0;
                lVar6 = local_4c8;
                goto LAB_0010ee67;
              }
              puVar9 = puVar10 + (int)(uVar15 >> 3);
              lVar6 = local_4c8;
            }
            *puVar9 = pcVar13;
            puVar9 = puVar9 + 1;
            do {
              pcVar14 = pcVar13;
              pcVar13 = pcVar14 + 1;
              if (*pcVar14 == '\0') goto LAB_0010ed43;
            } while (*pcVar14 != ',');
            *pcVar14 = '\0';
          } while (*pcVar13 != '\0');
        }
LAB_0010ed43:
        *puVar9 = 0;
      }
LAB_0010ee67:
      if (lVar6 == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = *(undefined8 *)(lVar6 + 8);
      }
      size = xmlC14NDocDumpMemory(lVar4,uVar11,local_4d0,puVar10,local_4cc,&local_4b8);
      if ((int)size < 0) {
        fprintf(_stderr,"Error: failed to canonicalize XML file \"%s\" (ret=%d)\n",filename,
                (ulong)size);
LAB_0010ef7a:
        size = 0xffffffff;
LAB_0010eeb5:
        if ((char *)local_4b8.st_dev != (char *)0x0) {
          (*_xmlFree)();
        }
      }
      else if ((char *)local_4b8.st_dev != (char *)0x0) {
        iVar1 = compareFileMem(pcVar2,(char *)local_4b8.st_dev,size);
        if (iVar1 != 0) {
          c14nCommonTest_cold_6();
          goto LAB_0010ef7a;
        }
        goto LAB_0010eeb5;
      }
      if (lVar6 != 0) {
        xmlXPathFreeObject(lVar6);
      }
      if (puVar10 != (undefined8 *)0x0) {
        (*_xmlFree)(puVar10);
      }
      if (local_4d8 != (char *)0x0) {
        free(local_4d8);
      }
      xmlFreeDoc(lVar4);
      iVar1 = 0;
      if (-1 < (int)size) goto LAB_0010ef0e;
    }
  }
  goto LAB_0010ef09;
  while (iVar1 = xmlXPathRegisterNs(lVar8,plVar12[3],plVar12[2]), iVar1 == 0) {
LAB_0010eba7:
    plVar12 = (long *)*plVar12;
    if (plVar12 == (long *)0x0) {
      lVar6 = xmlXPathEvalExpression(lVar7,lVar8);
      if (lVar6 != 0) {
        (*_xmlFree)(lVar7);
        xmlXPathFreeContext(lVar8);
        xmlFreeDoc(lVar5);
        goto LAB_0010ec26;
      }
      c14nCommonTest_cold_2();
      goto LAB_0010ee4c;
    }
  }
  c14nCommonTest_cold_1();
LAB_0010ee4c:
  c14nCommonTest_cold_4();
LAB_0010ef09:
  iVar1 = 1;
LAB_0010ef0e:
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
  }
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  if (filename_00 != (char *)0x0) {
    free(filename_00);
  }
  return iVar1;
}

Assistant:

static int
c14nCommonTest(const char *filename, int with_comments, int mode,
               const char *subdir) {
    char buf[500];
    char prefix[500];
    const char *base;
    int len;
    char *result = NULL;
    char *xpath = NULL;
    char *ns = NULL;
    int ret = 0;

    base = baseFilename(filename);
    len = strlen(base);
    len -= 4;
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(buf, 499, "result/c14n/%s/%s", subdir, prefix) >= 499)
        buf[499] = 0;
    result = strdup(buf);
    if (snprintf(buf, 499, "test/c14n/%s/%s.xpath", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	xpath = strdup(buf);
    }
    if (snprintf(buf, 499, "test/c14n/%s/%s.ns", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	ns = strdup(buf);
    }

    nb_tests++;
    if (c14nRunTest(filename, with_comments, mode,
                    xpath, ns, result) < 0)
        ret = 1;

    if (result != NULL) free(result);
    if (xpath != NULL) free(xpath);
    if (ns != NULL) free(ns);
    return(ret);
}